

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

Byte ppmd_read(void *p)

{
  rar_br *br_00;
  ssize_t sVar1;
  int iVar2;
  undefined8 *in_RDI;
  Byte b;
  rar_br *br;
  rar *rar;
  archive_read *a;
  rar_br *prVar3;
  archive_read *a_00;
  
  a_00 = (archive_read *)*in_RDI;
  br_00 = (rar_br *)a_00->format->data;
  if ((((int)br_00[0x276].avail_in < 8) &&
      (prVar3 = br_00, iVar2 = rar_br_fillup(a_00,br_00), iVar2 == 0)) &&
     ((int)br_00[0x276].avail_in < 8)) {
    archive_set_error(&a_00->archive,0x54,"Truncated RAR file data");
    *(undefined1 *)&prVar3[6].cache_avail = 0;
    return '\0';
  }
  sVar1 = br_00[0x276].avail_in;
  *(int *)&br_00[0x276].avail_in = (int)br_00[0x276].avail_in + -8;
  return (Byte)(*(ulong *)&br_00[0x276].cache_avail >> ((char)(int)sVar1 - 8U & 0x3f));
}

Assistant:

static Byte
ppmd_read(void *p)
{
  struct archive_read *a = ((IByteIn*)p)->a;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);
  Byte b;
  if (!rar_br_read_ahead(a, br, 8))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return 0;
  }
  b = rar_br_bits(br, 8);
  rar_br_consume(br, 8);
  return b;
}